

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewtObj.c
# Opt level: O3

int NewtRefFunctionType(newtRefArg r)

{
  _Bool _Var1;
  uint16_t uVar2;
  newtRef r1;
  
  uVar2 = NewtGetRefType(r,true);
  if (uVar2 == 0xb) {
    r1 = NcClassOf(r);
    _Var1 = NewtRefEqual(r1,newt_sym.CodeBlock);
    if (_Var1) {
      return 1;
    }
    if (r1 == 0x32) {
      return 2;
    }
    _Var1 = NewtRefEqual(r1,newt_sym._function.native0);
    if (_Var1) {
      return 3;
    }
    _Var1 = NewtRefEqual(r1,newt_sym._function.native);
    if (_Var1) {
      return 4;
    }
  }
  return 0;
}

Assistant:

int NewtRefFunctionType(newtRefArg r)
{
    if (NewtRefIsFrame(r))
    {
        newtRefVar	klass;
        
        klass = NcClassOf(r);
        
        if (NewtRefEqual(klass, NSSYM0(CodeBlock)))
            return kNewtCodeBlock;
        
        if (klass==50) // special code
            return kNewtCodeBlock21;

        if (NewtRefEqual(klass, NSSYM0(_function.native0)))
            return kNewtNativeFn;
        
        if (NewtRefEqual(klass, NSSYM0(_function.native)))
            return kNewtNativeFunc;
    }
    
    return kNewtNotFunction;
}